

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixFullPathname(sqlite3_vfs *pVfs,char *zPath,int nOut,char *zOut)

{
  int errcode;
  long lVar1;
  long in_FS_OFFSET;
  undefined1 local_1058 [8];
  DbPath path;
  char *zOut_local;
  int nOut_local;
  char *zPath_local;
  sqlite3_vfs *pVfs_local;
  char local_1018 [8];
  char zPwd [4098];
  
  unique0x00012000 = *(long *)(in_FS_OFFSET + 0x28);
  local_1058._0_4_ = 0;
  path.zOut._4_4_ = 0;
  local_1058._4_4_ = 0;
  path._0_8_ = zOut;
  path.zOut._0_4_ = nOut;
  path._16_8_ = zOut;
  if (*zPath != '/') {
    lVar1 = (*aSyscall[3].pCurrent)(local_1018,0x1000);
    if (lVar1 == 0) {
      errcode = sqlite3CantopenError(0xa42e);
      pVfs_local._4_4_ = unixLogErrorAtLine(errcode,"getcwd",zPath,0xa42e);
      goto LAB_00123bdc;
    }
    appendAllPathElements((DbPath *)local_1058,local_1018);
  }
  appendAllPathElements((DbPath *)local_1058,zPath);
  *(undefined1 *)(path._16_8_ + (long)path.zOut._4_4_) = 0;
  if ((local_1058._0_4_ == 0) && (1 < path.zOut._4_4_)) {
    if (local_1058._4_4_ == 0) {
      pVfs_local._4_4_ = 0;
    }
    else {
      pVfs_local._4_4_ = 0x200;
    }
  }
  else {
    pVfs_local._4_4_ = sqlite3CantopenError(0xa434);
  }
LAB_00123bdc:
  if (*(long *)(in_FS_OFFSET + 0x28) == stack0xfffffffffffffff0) {
    return pVfs_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

static int unixFullPathname(
  sqlite3_vfs *pVfs,            /* Pointer to vfs object */
  const char *zPath,            /* Possibly relative input path */
  int nOut,                     /* Size of output buffer in bytes */
  char *zOut                    /* Output buffer */
){
  DbPath path;
  UNUSED_PARAMETER(pVfs);
  path.rc = 0;
  path.nUsed = 0;
  path.nSymlink = 0;
  path.nOut = nOut;
  path.zOut = zOut;
  if( zPath[0]!='/' ){
    char zPwd[SQLITE_MAX_PATHLEN+2];
    if( osGetcwd(zPwd, sizeof(zPwd)-2)==0 ){
      return unixLogError(SQLITE_CANTOPEN_BKPT, "getcwd", zPath);
    }
    appendAllPathElements(&path, zPwd);
  }
  appendAllPathElements(&path, zPath);
  zOut[path.nUsed] = 0;
  if( path.rc || path.nUsed<2 ) return SQLITE_CANTOPEN_BKPT;
  if( path.nSymlink ) return SQLITE_OK_SYMLINK;
  return SQLITE_OK;
}